

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intUtil.c
# Opt level: O2

int Inter_ManCheckAllStates(Aig_Man_t *p)

{
  int iVar1;
  abctime aVar2;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  abctime aVar3;
  int level;
  uint uVar4;
  
  aVar2 = Abc_Clock();
  p_00 = Cnf_Derive(p,p->nRegs);
  uVar4 = 1;
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  Cnf_DataFree(p_00);
  if (s != (sat_solver *)0x0) {
    iVar1 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
    sat_solver_delete(s);
    level = (int)s;
    Abc_Print(level,"%s =","Time");
    aVar3 = Abc_Clock();
    Abc_Print(level,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
    uVar4 = (uint)(iVar1 == -1);
  }
  return uVar4;
}

Assistant:

int Inter_ManCheckAllStates( Aig_Man_t * p )
{
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    int status;
    abctime clk = Abc_Clock();
    pCnf = Cnf_Derive( p, Saig_ManRegNum(p) ); 
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    Cnf_DataFree( pCnf );
    if ( pSat == NULL )
        return 1;
    status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    sat_solver_delete( pSat );
    ABC_PRT( "Time", Abc_Clock() - clk );
    return status == l_False;
}